

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

void cleanup_pits(void)

{
  pit_color_profile *ppVar1;
  pit_forbidden_monster *ppVar2;
  pit_monster_profile *ppVar3;
  pit_profile *ppVar4;
  pit_monster_profile *bn;
  pit_monster_profile *b;
  pit_forbidden_monster *mn;
  pit_forbidden_monster *m;
  pit_color_profile *cn;
  pit_color_profile *c;
  pit_profile *pit;
  wchar_t idx;
  
  for (pit._4_4_ = 0; ppVar4 = pit_info, pit._4_4_ < (int)(uint)z_info->pit_max;
      pit._4_4_ = pit._4_4_ + 1) {
    cn = pit_info[pit._4_4_].colors;
    while (cn != (pit_color_profile *)0x0) {
      ppVar1 = cn->next;
      mem_free(cn);
      cn = ppVar1;
    }
    mn = ppVar4[pit._4_4_].forbidden_monsters;
    while (mn != (pit_forbidden_monster *)0x0) {
      ppVar2 = mn->next;
      mem_free(mn);
      mn = ppVar2;
    }
    bn = ppVar4[pit._4_4_].bases;
    while (bn != (pit_monster_profile *)0x0) {
      ppVar3 = bn->next;
      mem_free(bn);
      bn = ppVar3;
    }
    string_free(pit_info[pit._4_4_].name);
  }
  mem_free(pit_info);
  return;
}

Assistant:

static void cleanup_pits(void)
{
	int idx;
	
	for (idx = 0; idx < z_info->pit_max; idx++) {
		struct pit_profile *pit = &pit_info[idx];
		struct pit_color_profile *c, *cn;
		struct pit_forbidden_monster *m, *mn;
		struct pit_monster_profile *b, *bn;
		
		c = pit->colors;
		while (c) {
			cn = c->next;
			mem_free(c);
			c = cn;
		}
		m = pit->forbidden_monsters;
		while (m) {
			mn = m->next;
			mem_free(m);
			m = mn;
		}
		b = pit->bases;
		while (b) {
			bn = b->next;
			mem_free(b);
			b = bn;
		}
		string_free((char *)pit_info[idx].name);
		
	}
	mem_free(pit_info);
}